

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O3

void __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::RegisterImports
          (NimBfbsGenerator *this,Object *object,Field *field,bool use_element)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t __n;
  pointer pcVar2;
  string orig_str;
  string orig_str_00;
  undefined8 uVar3;
  pointer __position;
  pointer pbVar4;
  int iVar5;
  long lVar6;
  mapped_type *pmVar7;
  Schema *pSVar8;
  long *plVar9;
  undefined7 in_register_00000009;
  Field *pFVar10;
  long *plVar11;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  string ns;
  string type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str2_vec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relative_to_vec;
  string importns;
  string import_path;
  undefined8 in_stack_fffffffffffffe58;
  _Alloc_hider in_stack_fffffffffffffe60;
  _Alloc_hider _Var16;
  size_type sVar17;
  undefined2 in_stack_fffffffffffffe70;
  undefined2 uVar18;
  undefined6 in_stack_fffffffffffffe72;
  undefined1 local_180 [32];
  char *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_140 [32];
  long *local_120 [2];
  long local_110 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  string local_b0;
  value_type local_90;
  key_type local_70;
  undefined2 *local_50;
  undefined8 local_48;
  undefined2 local_40;
  undefined6 uStack_3e;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_160 = local_158._M_local_buf + 8;
  local_158._M_allocated_capacity = 0;
  local_158._M_local_buf[8] = '\0';
  lVar6 = (long)*(int *)field;
  if ((int)CONCAT71(in_register_00000009,use_element) == 0) {
    if ((*(ushort *)(field + -lVar6) < 7) ||
       (uVar14 = (ulong)*(ushort *)(field + -lVar6 + 6), uVar14 == 0)) {
      pFVar10 = (Field *)0x0;
    }
    else {
      pFVar10 = field + *(uint *)(field + uVar14) + uVar14;
    }
    if (4 < *(ushort *)(pFVar10 + -(long)*(int *)pFVar10)) {
      uVar13 = *(ushort *)(pFVar10 + (4 - (long)*(int *)pFVar10));
      goto LAB_0032ef27;
    }
LAB_0032ef63:
    if ((*(ushort *)(field + -lVar6) < 7) ||
       (uVar14 = (ulong)*(ushort *)(field + -lVar6 + 6), uVar14 == 0)) {
      pFVar10 = (Field *)0x0;
    }
    else {
      pFVar10 = field + *(uint *)(field + uVar14) + uVar14;
    }
    if ((*(ushort *)(pFVar10 + -(long)*(int *)pFVar10) < 9) ||
       ((ulong)*(ushort *)(pFVar10 + (8 - (long)*(int *)pFVar10)) == 0)) {
LAB_0032efe4:
      pSVar8 = (Schema *)0x0;
    }
    else {
      iVar5 = *(int *)(pFVar10 + *(ushort *)(pFVar10 + (8 - (long)*(int *)pFVar10)));
      pSVar8 = (this->super_BaseBfbsGenerator).schema_;
      if (iVar5 < 0 || pSVar8 == (Schema *)0x0) goto LAB_0032efe4;
      uVar14 = (ulong)*(ushort *)(pSVar8 + (6 - (long)*(int *)pSVar8));
      if (*(int *)(pSVar8 + *(uint *)(pSVar8 + uVar14) + uVar14) <= iVar5) goto LAB_0032efe4;
      lVar6 = *(uint *)(pSVar8 + uVar14) + uVar14;
      pSVar8 = pSVar8 + (ulong)*(uint *)(pSVar8 + (ulong)(uint)(iVar5 << 2) + lVar6 + 4) +
                        (ulong)(uint)(iVar5 << 2) + lVar6 + 4;
    }
    if (pSVar8 == (Schema *)this->current_enum_) goto LAB_0032f5c0;
    local_180._8_8_ = (string *)0x0;
    local_180[0x10] = '\0';
    uVar14 = (ulong)*(ushort *)(pSVar8 + (4 - (long)*(int *)pSVar8));
    local_180._0_8_ = local_180 + 0x10;
    local_140._0_8_ = local_140 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_140,pSVar8 + (ulong)*(uint *)(pSVar8 + uVar14) + 4 + uVar14,
               pSVar8 + (ulong)*(uint *)(pSVar8 + (ulong)*(uint *)(pSVar8 + uVar14) + 4 + uVar14 +
                                        -4) + *(uint *)(pSVar8 + uVar14) + uVar14 + 4);
    Denamespace((string *)&stack0xfffffffffffffe60,this,(string *)local_140,&local_b0,
                (string *)local_180);
    std::__cxx11::string::operator=((string *)&local_160,(string *)&stack0xfffffffffffffe60);
    if (in_stack_fffffffffffffe60._M_p != &stack0xfffffffffffffe70) {
      operator_delete(in_stack_fffffffffffffe60._M_p,
                      CONCAT62(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70) + 1);
    }
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    uVar3 = local_180._8_8_;
    _Var16._M_p = &stack0xfffffffffffffe70;
    if ((string *)local_180._8_8_ == (string *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xfffffffffffffe60,local_160,
                 local_160 + local_158._M_allocated_capacity);
    }
    else {
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,local_180._0_8_,(pointer)(local_180._0_8_ + local_180._8_8_));
      std::__cxx11::string::append((char *)local_120);
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)local_120,(ulong)local_160);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        in_stack_fffffffffffffe70 = (undefined2)*plVar11;
        in_stack_fffffffffffffe72 = (undefined6)((ulong)*plVar11 >> 0x10);
      }
      else {
        in_stack_fffffffffffffe70 = (undefined2)*plVar11;
        in_stack_fffffffffffffe72 = (undefined6)((ulong)*plVar11 >> 0x10);
        _Var16._M_p = (pointer)*plVar9;
      }
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
    }
    std::__cxx11::string::operator=((string *)&local_160,(string *)&stack0xfffffffffffffe60);
    if (_Var16._M_p != &stack0xfffffffffffffe70) {
      operator_delete(_Var16._M_p,CONCAT62(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70) + 1)
      ;
    }
    if (((string *)uVar3 != (string *)0x0) && (local_120[0] != local_110)) {
      operator_delete(local_120[0],local_110[0] + 1);
    }
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
LAB_0032f1b4:
      operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
    }
  }
  else {
    if ((*(ushort *)(field + -lVar6) < 7) ||
       (uVar14 = (ulong)*(ushort *)(field + -lVar6 + 6), uVar14 == 0)) {
      pFVar10 = (Field *)0x0;
    }
    else {
      pFVar10 = field + *(uint *)(field + uVar14) + uVar14;
    }
    if (*(ushort *)(pFVar10 + -(long)*(int *)pFVar10) < 7) goto LAB_0032ef63;
    uVar13 = *(ushort *)(pFVar10 + (6 - (long)*(int *)pFVar10));
LAB_0032ef27:
    if ((uVar13 == 0) || (pFVar10[uVar13].super_Table != (Table)0xf)) goto LAB_0032ef63;
    if ((*(ushort *)(field + -lVar6) < 7) ||
       (uVar14 = (ulong)*(ushort *)(field + -lVar6 + 6), uVar14 == 0)) {
      pFVar10 = (Field *)0x0;
    }
    else {
      pFVar10 = field + *(uint *)(field + uVar14) + uVar14;
    }
    if ((*(ushort *)(pFVar10 + -(long)*(int *)pFVar10) < 9) ||
       ((ulong)*(ushort *)(pFVar10 + (8 - (long)*(int *)pFVar10)) == 0)) {
LAB_0032f653:
      pSVar8 = (Schema *)0x0;
    }
    else {
      iVar5 = *(int *)(pFVar10 + *(ushort *)(pFVar10 + (8 - (long)*(int *)pFVar10)));
      pSVar8 = (this->super_BaseBfbsGenerator).schema_;
      if (iVar5 < 0 || pSVar8 == (Schema *)0x0) goto LAB_0032f653;
      uVar14 = (ulong)*(ushort *)(pSVar8 + (4 - (long)*(int *)pSVar8));
      if (*(int *)(pSVar8 + *(uint *)(pSVar8 + uVar14) + uVar14) <= iVar5) goto LAB_0032f653;
      lVar6 = *(uint *)(pSVar8 + uVar14) + uVar14;
      pSVar8 = pSVar8 + (ulong)*(uint *)(pSVar8 + (ulong)(uint)(iVar5 << 2) + lVar6 + 4) +
                        (ulong)(uint)(iVar5 << 2) + lVar6 + 4;
    }
    if (pSVar8 == (Schema *)this->current_obj_) goto LAB_0032f5c0;
    local_180._8_8_ = (string *)0x0;
    local_180[0x10] = '\0';
    uVar14 = (ulong)*(ushort *)(pSVar8 + (4 - (long)*(int *)pSVar8));
    local_180._0_8_ = local_180 + 0x10;
    local_140._0_8_ = local_140 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_140,pSVar8 + (ulong)*(uint *)(pSVar8 + uVar14) + 4 + uVar14,
               pSVar8 + (ulong)*(uint *)(pSVar8 + (ulong)*(uint *)(pSVar8 + uVar14) + 4 + uVar14 +
                                        -4) + *(uint *)(pSVar8 + uVar14) + uVar14 + 4);
    Denamespace((string *)&stack0xfffffffffffffe60,this,(string *)local_140,&local_b0,
                (string *)local_180);
    std::__cxx11::string::operator=((string *)&local_160,(string *)&stack0xfffffffffffffe60);
    if (in_stack_fffffffffffffe60._M_p != &stack0xfffffffffffffe70) {
      operator_delete(in_stack_fffffffffffffe60._M_p,
                      CONCAT62(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70) + 1);
    }
    if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
      operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
    }
    uVar3 = local_180._8_8_;
    _Var16._M_p = &stack0xfffffffffffffe70;
    if ((string *)local_180._8_8_ == (string *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xfffffffffffffe60,local_160,
                 local_160 + local_158._M_allocated_capacity);
    }
    else {
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,local_180._0_8_,(pointer)(local_180._0_8_ + local_180._8_8_));
      std::__cxx11::string::append((char *)local_120);
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)local_120,(ulong)local_160);
      plVar11 = plVar9 + 2;
      if ((long *)*plVar9 == plVar11) {
        in_stack_fffffffffffffe70 = (undefined2)*plVar11;
        in_stack_fffffffffffffe72 = (undefined6)((ulong)*plVar11 >> 0x10);
      }
      else {
        in_stack_fffffffffffffe70 = (undefined2)*plVar11;
        in_stack_fffffffffffffe72 = (undefined6)((ulong)*plVar11 >> 0x10);
        _Var16._M_p = (pointer)*plVar9;
      }
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
    }
    std::__cxx11::string::operator=((string *)&local_160,(string *)&stack0xfffffffffffffe60);
    if (_Var16._M_p != &stack0xfffffffffffffe70) {
      operator_delete(_Var16._M_p,CONCAT62(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70) + 1)
      ;
    }
    if (((string *)uVar3 != (string *)0x0) && (local_120[0] != local_110)) {
      operator_delete(local_120[0],local_110[0] + 1);
    }
    if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) goto LAB_0032f1b4;
  }
  uVar14 = (ulong)*(ushort *)(object + (4 - (long)*(int *)object));
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,object + (ulong)*(uint *)(object + uVar14) + 4 + uVar14,
             object + (ulong)*(uint *)(object + (ulong)*(uint *)(object + uVar14) + 4 + uVar14 + -4)
                      + *(uint *)(object + uVar14) + uVar14 + 4);
  local_180._0_8_ = (NimBfbsGenerator *)(local_180 + 0x10);
  std::__cxx11::string::_M_construct<char*>((string *)local_180,local_d0,(long)local_d0 + local_c8);
  uVar18 = 0x2e;
  sVar17 = 1;
  orig_str._M_string_length = (size_type)&stack0xfffffffffffffe70;
  orig_str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
  orig_str.field_2._M_allocated_capacity = 1;
  orig_str.field_2._8_2_ = 0x2e;
  orig_str.field_2._10_6_ = in_stack_fffffffffffffe72;
  _Var16._M_p = &stack0xfffffffffffffe70;
  StringSplit(&local_e8,(NimBfbsGenerator *)local_180._0_8_,orig_str,(string *)local_180._8_8_);
  if (_Var16._M_p != &stack0xfffffffffffffe70) {
    operator_delete(_Var16._M_p,CONCAT62(in_stack_fffffffffffffe72,uVar18) + 1);
  }
  if ((NimBfbsGenerator *)local_180._0_8_ != (NimBfbsGenerator *)(local_180 + 0x10)) {
    operator_delete((void *)local_180._0_8_,CONCAT71(local_180._17_7_,local_180[0x10]) + 1);
  }
  local_140._0_8_ = (NimBfbsGenerator *)(local_140 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,local_160,local_160 + local_158._M_allocated_capacity);
  local_40 = 0x2e;
  local_48 = 1;
  orig_str_00._M_string_length = (size_type)_Var16._M_p;
  orig_str_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
  orig_str_00.field_2._M_allocated_capacity = sVar17;
  orig_str_00.field_2._8_2_ = uVar18;
  orig_str_00.field_2._10_6_ = in_stack_fffffffffffffe72;
  local_50 = &local_40;
  StringSplit(&local_100,(NimBfbsGenerator *)local_140._0_8_,orig_str_00,(string *)local_140._8_8_);
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT62(uStack_3e,local_40) + 1);
  }
  if ((NimBfbsGenerator *)local_140._0_8_ != (NimBfbsGenerator *)(local_140 + 0x10)) {
    operator_delete((void *)local_140._0_8_,local_140._16_8_ + 1);
  }
  while ((((pbVar4 = local_e8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
           __position = local_e8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
           pbVar15 = local_e8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
           local_e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start &&
           (pbVar15 = __position,
           local_100.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_100.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)) &&
          (__n = (local_e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,
          __n == (local_100.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)) &&
         ((__n == 0 ||
          (iVar5 = bcmp(((local_e8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        ((local_100.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,__n),
          iVar5 == 0))))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_e8,(iterator)__position);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_100,
               (iterator)
               local_100.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
  pcVar2 = pbVar4[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pbVar4[-1].field_2) {
    operator_delete(pcVar2,pbVar4[-1].field_2._M_allocated_capacity + 1);
    pbVar15 = local_e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar15) {
    uVar14 = 0;
    do {
      local_90.field_2._0_2_ = 0x2e2e;
      local_90._M_string_length = 2;
      local_90.field_2._M_local_buf[2] = '\0';
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&local_100,
                       (const_iterator)
                       local_100.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT53(local_90.field_2._3_5_,
                                 CONCAT12(local_90.field_2._M_local_buf[2],local_90.field_2._0_2_))
                        + 1);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)local_e8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (local_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_100.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 8;
    uVar14 = 0;
    do {
      std::__cxx11::string::_M_append
                ((char *)&local_70,
                 *(ulong *)((long)local_100.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar6 + -8));
      uVar12 = (long)local_100.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_100.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar14 != uVar12 - 1) {
        std::__cxx11::string::append((char *)&local_70);
        uVar12 = (long)local_100.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_100.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      uVar14 = uVar14 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar14 < uVar12);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_158._M_allocated_capacity != 0) {
    sVar17 = 0;
    do {
      if (local_160[sVar17] == '.') {
        local_160[sVar17] = '_';
      }
      sVar17 = sVar17 + 1;
    } while (local_158._M_allocated_capacity != sVar17);
  }
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->imports_,&local_70);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if (local_160 != local_158._M_local_buf + 8) {
    operator_delete(local_160,CONCAT71(local_158._9_7_,local_158._M_local_buf[8]) + 1);
  }
LAB_0032f5c0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RegisterImports(const r::Object *object, const r::Field *field,
                       bool use_element = false) {
    std::string importns;
    std::string type_name;

    const r::BaseType type =
        use_element ? field->type()->element() : field->type()->base_type();

    if (IsStructOrTable(type)) {
      const r::Object *object_def = GetObjectByIndex(field->type()->index());
      if (object_def == current_obj_) { return; }
      std::string ns;
      type_name = Denamespace(object_def->name()->str(), importns, ns);
      type_name = ns.empty() ? type_name : ns + "." + type_name;
    } else {
      const r::Enum *enum_def = GetEnumByIndex(field->type()->index());
      if (enum_def == current_enum_) { return; }
      std::string ns;
      type_name = Denamespace(enum_def->name()->str(), importns, ns);
      type_name = ns.empty() ? type_name : ns + "." + type_name;
    }

    std::string import_path =
        GetRelativePathFromNamespace(object->name()->str(), type_name);
    std::replace(type_name.begin(), type_name.end(), '.', '_');
    RegisterImports(import_path, importns);
  }